

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.h
# Opt level: O1

void __thiscall
cppcms::impl::
handler_binder_p0<void_(cppcms::impl::tcp_pipe::*)(),_std::shared_ptr<cppcms::impl::tcp_pipe>_>::
handler_binder_p0(handler_binder_p0<void_(cppcms::impl::tcp_pipe::*)(),_std::shared_ptr<cppcms::impl::tcp_pipe>_>
                  *this,offset_in_tcp_pipe_to_subr *f,shared_ptr<cppcms::impl::tcp_pipe> *s)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  offset_in_tcp_pipe_to_subr oVar2;
  
  (this->super_callable_type).super_refcounted._vptr_refcounted =
       (_func_int **)&PTR__refcounted_00287bd8;
  booster::atomic_counter::atomic_counter(&(this->super_callable_type).super_refcounted.refs_,0);
  (this->super_callable_type).super_refcounted._vptr_refcounted =
       (_func_int **)&PTR__handler_binder_p0_0028c0f0;
  oVar2 = f[1];
  this->f_ = *f;
  *(offset_in_tcp_pipe_to_subr *)&this->field_0x18 = oVar2;
  (this->s_).super___shared_ptr<cppcms::impl::tcp_pipe,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (s->super___shared_ptr<cppcms::impl::tcp_pipe,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (s->super___shared_ptr<cppcms::impl::tcp_pipe,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (this->s_).super___shared_ptr<cppcms::impl::tcp_pipe,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  return;
}

Assistant:

handler_binder_p0(F const &f,S const &s) : f_(f), s_(s) {}